

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode Curl_cf_ssl_insert_after(Curl_cfilter *cf_at,Curl_easy *data)

{
  CURLcode CVar1;
  Curl_cfilter *in_RAX;
  Curl_cfilter *cf;
  Curl_cfilter *local_18;
  
  local_18 = in_RAX;
  CVar1 = cf_ssl_create(&local_18,data,cf_at->conn);
  if (CVar1 == CURLE_OK) {
    Curl_conn_cf_insert_after(cf_at,local_18);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_cf_ssl_insert_after(struct Curl_cfilter *cf_at,
                                  struct Curl_easy *data)
{
  struct Curl_cfilter *cf;
  CURLcode result;

  result = cf_ssl_create(&cf, data, cf_at->conn);
  if(!result)
    Curl_conn_cf_insert_after(cf_at, cf);
  return result;
}